

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcMapping.c
# Opt level: O3

void Sparc_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  unsigned_short uVar4;
  uint uVar5;
  long lVar6;
  cs_detail *pcVar7;
  
  uVar4 = insn_find(insns,0x1b9,id,&h->insn_cache);
  if (uVar4 != 0) {
    insn->id = (uint)insns[uVar4].mapid;
    if (h->detail != CS_OPT_OFF) {
      pcVar7 = insn->detail;
      *(undefined8 *)(pcVar7->regs_read + 8) = *(undefined8 *)(insns[uVar4].regs_use + 8);
      uVar1 = *(undefined8 *)(insns[uVar4].regs_use + 4);
      *(undefined8 *)pcVar7->regs_read = *(undefined8 *)insns[uVar4].regs_use;
      *(undefined8 *)(pcVar7->regs_read + 4) = uVar1;
      uVar5 = count_positive(insns[uVar4].regs_use);
      pcVar7 = insn->detail;
      pcVar7->regs_read_count = (uint8_t)uVar5;
      *(undefined8 *)(pcVar7->regs_write + 0x10) = *(undefined8 *)(insns[uVar4].regs_mod + 0x10);
      uVar1 = *(undefined8 *)insns[uVar4].regs_mod;
      uVar2 = *(undefined8 *)(insns[uVar4].regs_mod + 4);
      uVar3 = *(undefined8 *)(insns[uVar4].regs_mod + 0xc);
      *(undefined8 *)(pcVar7->regs_write + 8) = *(undefined8 *)(insns[uVar4].regs_mod + 8);
      *(undefined8 *)(pcVar7->regs_write + 0xc) = uVar3;
      *(undefined8 *)pcVar7->regs_write = uVar1;
      *(undefined8 *)(pcVar7->regs_write + 4) = uVar2;
      uVar5 = count_positive(insns[uVar4].regs_mod);
      pcVar7 = insn->detail;
      pcVar7->regs_write_count = (uint8_t)uVar5;
      *(undefined8 *)pcVar7->groups = *(undefined8 *)insns[uVar4].groups;
      uVar5 = count_positive8(insns[uVar4].groups);
      pcVar7 = insn->detail;
      pcVar7->groups_count = (uint8_t)uVar5;
      if ((insns[uVar4].branch != false) || (insns[uVar4].indirect_branch == true)) {
        pcVar7->groups[uVar5 & 0xff] = '\x01';
        pcVar7 = insn->detail;
        pcVar7->groups_count = pcVar7->groups_count + '\x01';
      }
      lVar6 = 0;
      do {
        if (insn_hints[lVar6].id == id) {
          *(uint *)((long)&pcVar7->field_6 + 4) = (uint)insn_hints[lVar6].hints;
          return;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x12);
    }
  }
  return;
}

Assistant:

void Sparc_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	unsigned short i;

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive8(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = SPARC_GRP_JUMP;
				insn->detail->groups_count++;
			}
#endif
			// hint code
			for (i = 0; i < ARR_SIZE(insn_hints); i++) {
				if (id == insn_hints[i].id) {
					insn->detail->sparc.hint = insn_hints[i].hints;
					break;
				}
			}
		}
	}
}